

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteScriptModule
          (BinaryWriterSpec *this,string_view filename,ScriptModule *script_module)

{
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  string_view filename_00;
  ScriptModuleType SVar1;
  TextScriptModule *pTVar2;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar3;
  Stream *pSVar4;
  DataScriptModule<(wabt::ScriptModuleType)2> *pDVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  BinaryWriterSpec *local_70;
  size_t local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  BinaryWriterSpec *local_48;
  size_t local_40;
  BinaryWriterSpec *local_38;
  char *local_30;
  ScriptModule *local_28;
  ScriptModule *script_module_local;
  BinaryWriterSpec *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (BinaryWriterSpec *)filename._M_len;
  local_28 = script_module;
  script_module_local = (ScriptModule *)this;
  SVar1 = ScriptModule::type(script_module);
  if (SVar1 == Text) {
    local_38 = this_local;
    local_30 = (char *)filename_local._M_len;
    pTVar2 = cast<wabt::TextScriptModule,wabt::ScriptModule>(local_28);
    filename_00._M_str = local_30;
    filename_00._M_len = (size_t)local_38;
    WriteModule(this,filename_00,&pTVar2->module);
  }
  else if (SVar1 == Binary) {
    local_48 = this_local;
    local_40 = filename_local._M_len;
    __args_00._M_str = (char *)filename_local._M_len;
    __args_00._M_len = (size_t)this_local;
    pSVar4 = std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::
             operator()(&this->module_stream_factory_,__args_00);
    pDVar3 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>(local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_60,&pDVar3->data);
    Stream::WriteData<unsigned_char>(pSVar4,&local_60,"",No);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_60);
  }
  else if (SVar1 == Quoted) {
    local_70 = this_local;
    local_68 = filename_local._M_len;
    __args._M_str = (char *)filename_local._M_len;
    __args._M_len = (size_t)this_local;
    pSVar4 = std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::
             operator()(&this->module_stream_factory_,__args);
    pDVar5 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,wabt::ScriptModule>(local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_88,&pDVar5->data);
    Stream::WriteData<unsigned_char>(pSVar4,&local_88,"",No);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  }
  return;
}

Assistant:

void BinaryWriterSpec::WriteScriptModule(std::string_view filename,
                                         const ScriptModule& script_module) {
  switch (script_module.type()) {
    case ScriptModuleType::Text:
      WriteModule(filename, cast<TextScriptModule>(&script_module)->module);
      break;

    case ScriptModuleType::Binary:
      module_stream_factory_(filename)->WriteData(
          cast<BinaryScriptModule>(&script_module)->data, "");
      break;

    case ScriptModuleType::Quoted:
      module_stream_factory_(filename)->WriteData(
          cast<QuotedScriptModule>(&script_module)->data, "");
      break;
  }
}